

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

void Col_RopeIterBackward(ColRopeIterator *it,size_t nb)

{
  void **ppvVar1;
  Col_StringFormat CVar2;
  ulong uVar3;
  ulong uVar4;
  Col_Char2 *pCVar5;
  Col_Char1 *pCVar6;
  ulong uVar7;
  bool bVar8;
  
  if (nb != 0) {
    uVar3 = it->length;
    uVar4 = it->index;
    if (uVar4 < uVar3) {
      uVar7 = uVar4 - nb;
      if (uVar4 < nb) {
        (it->chunk).first = 0xffffffffffffffff;
        if (it->rope == 0) {
          (it->chunk).last = uVar4;
        }
        it->index = uVar3;
      }
      else {
        it->index = uVar7;
        if (((it->chunk).first <= uVar7) && (uVar7 <= (it->chunk).last)) {
          if ((it->chunk).accessProc == (undefined1 *)0x0) {
            CVar2 = (it->chunk).current.direct.format;
            if ((CVar2 - COL_UCS1 < 2) || (CVar2 == COL_UCS4)) {
              ppvVar1 = &(it->chunk).current.direct.address;
              *ppvVar1 = (void *)((long)*ppvVar1 - CVar2 * nb);
            }
            else if (CVar2 == COL_UTF8) {
              while (bVar8 = nb != 0, nb = nb - 1, bVar8) {
                pCVar6 = Col_Utf8Prev((Col_Char1 *)(it->chunk).current.direct.address);
                (it->chunk).current.direct.address = pCVar6;
              }
            }
            else if (CVar2 == COL_UTF16) {
              while (bVar8 = nb != 0, nb = nb - 1, bVar8) {
                pCVar5 = Col_Utf16Prev((Col_Char2 *)(it->chunk).current.direct.address);
                (it->chunk).current.direct.address = pCVar5;
              }
            }
          }
          else {
            ppvVar1 = &(it->chunk).current.direct.address;
            *ppvVar1 = (void *)((long)*ppvVar1 - nb);
          }
        }
      }
    }
    else if (nb <= uVar3) {
      if (it->rope == 0) {
        it->index = (it->chunk).last;
        (it->chunk).first = 0;
        (it->chunk).last = uVar3 - 1;
        Col_RopeIterMoveTo(it,uVar3 - nb);
        return;
      }
      it->index = uVar3 - nb;
    }
  }
  return;
}

Assistant:

void
Col_RopeIterBackward(
    Col_RopeIterator it,    /*!< The iterator to move. */
    size_t nb)              /*!< Offset to move backward. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPEITER,it} */
    TYPECHECK_ROPEITER(it) return;

    if (nb == 0) {
        /*
         * No-op.
         */

        return;
    }

    if (Col_RopeIterEnd(it)) {
        /*
         * Allow iterators at end to go back.
         */

        if (nb > it->length) {
            /*
             * No-op.
             */

            return;
        }

        if (it->rope == WORD_NIL) {
            /* 
             * String iterator mode, restore previous position and move to the
             * new one (see Col_RopeIterForward and below).
             */
            it->index = it->chunk.last;
            it->chunk.first = 0;
            it->chunk.last = it->length-1;
            Col_RopeIterMoveTo(it, it->length-nb);
            return;
        }

        it->index = it->length-nb;
        return;
    } else if (it->index < nb) {
        /*
         * Beginning of rope, set iterator at end.
         */

        it->chunk.first = SIZE_MAX; /* Invalidate traversal info. */
        if (it->rope == WORD_NIL) {
            /* 
             * String iterator mode, save current index for backward iteration
             * from end (see above).
             */
            it->chunk.last = it->index;
        }
        it->index = it->length;
        return;
    }

    it->index -= nb;
    if (it->index >= it->chunk.first && it->index <= it->chunk.last) {
        /*
         * Update current chunk pointer.
         */

        if (it->chunk.accessProc) it->chunk.current.access.index -= nb;
        else {
            ASSERT(it->chunk.current.direct.address);
            switch (it->chunk.current.direct.format) {
            case COL_UCS1:
            case COL_UCS2:
            case COL_UCS4:
                it->chunk.current.direct.address
                        = (const char *) it->chunk.current.direct.address
                        - nb * CHAR_WIDTH(it->chunk.current.direct.format);
                break;

            case COL_UTF8:
                while (nb--)
                    it->chunk.current.direct.address
                            = (const char *) Col_Utf8Prev(
                            (const Col_Char1 *) it->chunk.current.direct.address);
                break;

            case COL_UTF16:
                while (nb--)
                    it->chunk.current.direct.address
                            = (const char *) Col_Utf16Prev(
                            (const Col_Char2 *) it->chunk.current.direct.address);
                break;
            }
        }
    }
}